

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

bool __thiscall GraphBuilder::matchForksAndJoins(GraphBuilder *this)

{
  bool bVar1;
  type *ptVar2;
  reference ppVVar3;
  FunctionGraph *this_00;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  *in_RDI;
  FunctionGraph *functionGraph;
  Value *llvmFunction;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__range2_1;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> functions;
  type *forkNode;
  Node *foundInstruction;
  Value *forkcall;
  iterator __end2;
  iterator __begin2;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__range2;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> llvmforks;
  JoinNode *joinNode;
  pair<const_llvm::CallInst_*const,_JoinNode_*> *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
  *__range1;
  ForkJoinAnalysis FJA;
  bool changed;
  JoinNode *in_stack_ffffffffffffff28;
  Value *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_b0;
  undefined1 *local_a8;
  ForkNode *in_stack_ffffffffffffff60;
  JoinNode *in_stack_ffffffffffffff68;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_68;
  Value *local_60;
  Value local_58 [24];
  JoinNode *local_40;
  reference local_38;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false> local_28;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  *local_20;
  ForkJoinAnalysis local_18;
  byte local_9;
  
  local_9 = 0;
  dg::ForkJoinAnalysis::ForkJoinAnalysis(&local_18,(LLVMPointerAnalysis *)in_RDI->_M_current);
  local_20 = in_RDI + 0x1d;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
       ::begin((unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
                *)in_stack_ffffffffffffff28);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
       ::end((unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
              *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38 = std::__detail::
               _Node_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>
                          *)0x193e7c);
    local_40 = local_38->second;
    dg::ForkJoinAnalysis::matchJoin(local_58);
    local_60 = local_58;
    local_68._M_current =
         (Value **)
         std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::begin
                   ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                    in_stack_ffffffffffffff28);
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator*(&local_68);
      llvm::cast<llvm::Instruction,llvm::Value_const>((Value *)0x193f17);
      findInstruction((GraphBuilder *)in_stack_ffffffffffffff48._M_current,
                      (Instruction *)in_stack_ffffffffffffff40);
      ptVar2 = castNode<(NodeType)1,Node>(&in_stack_ffffffffffffff28->super_Node);
      if (ptVar2 != (type *)0x0) {
        local_9 = 1;
        JoinNode::addCorrespondingFork(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      }
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++(&local_68);
    }
    dg::ForkJoinAnalysis::joinFunctions((Value *)&stack0xffffffffffffff60);
    local_a8 = &stack0xffffffffffffff60;
    local_b0._M_current =
         (Value **)
         std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::begin
                   ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                    in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff48 =
         std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
                   ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                    in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      ppVVar3 = __gnu_cxx::
                __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                ::operator*(&local_b0);
      in_stack_ffffffffffffff40 = *ppVVar3;
      llvm::cast<llvm::Function,llvm::Value_const>((Value *)0x193ffa);
      this_00 = findFunction((GraphBuilder *)in_stack_ffffffffffffff48._M_current,
                             (Function *)in_stack_ffffffffffffff40);
      if (this_00 != (FunctionGraph *)0x0) {
        in_stack_ffffffffffffff28 = local_40;
        FunctionGraph::exitNode(this_00);
        JoinNode::addJoinPredecessor
                  (in_stack_ffffffffffffff68,(ExitNode *)in_stack_ffffffffffffff60);
        local_9 = 1;
      }
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++(&local_b0);
    }
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               in_stack_ffffffffffffff40);
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               in_stack_ffffffffffffff40);
    std::__detail::_Node_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false> *
                 )in_RDI);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool GraphBuilder::matchForksAndJoins() {
    using namespace llvm;
    bool changed = false;

    ForkJoinAnalysis FJA{pointsToAnalysis_};

    for (auto &it : llvmToJoins_) {
        // it.first -> llvm::CallInst, it.second -> RWNode *
        auto *joinNode = it.second;
        auto llvmforks = FJA.matchJoin(it.first);
        for (const auto *forkcall : llvmforks) {
            auto *foundInstruction =
                    findInstruction(cast<Instruction>(forkcall));
            auto *forkNode = castNode<NodeType::FORK>(foundInstruction);
            if (forkNode) {
                changed |= true;
                joinNode->addCorrespondingFork(forkNode);
            }
        }

        auto functions = FJA.joinFunctions(it.first);
        for (const auto *llvmFunction : functions) {
            auto *functionGraph = findFunction(cast<Function>(llvmFunction));
            if (functionGraph) {
                joinNode->addJoinPredecessor(functionGraph->exitNode());
                changed |= true;
            }
        }
    }

    return changed;
}